

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

int spki_table_copy_except_socket(spki_table *src,spki_table *dst,rtr_socket *socket)

{
  long lVar1;
  rtr_socket *prVar2;
  int iVar3;
  long lVar4;
  tommy_list ptVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  long in_FS_OFFSET;
  byte bVar8;
  spki_record record;
  
  bVar8 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&src->lock);
  ptVar5 = src->list;
  do {
    if (ptVar5 == (tommy_list)0x0) {
      iVar3 = 0;
LAB_0010c060:
      pthread_rwlock_unlock((pthread_rwlock_t *)&src->lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar3;
      }
      __stack_chk_fail();
    }
    puVar6 = (uint8_t *)ptVar5->data;
    record.asn = *(uint32_t *)(puVar6 + 0x14);
    prVar2 = *(rtr_socket **)(puVar6 + 0x78);
    record.ski._0_8_ = *(undefined8 *)puVar6;
    record.ski._8_8_ = *(undefined8 *)(puVar6 + 8);
    record.ski._16_4_ = *(undefined4 *)(puVar6 + 0x10);
    puVar6 = puVar6 + 0x18;
    puVar7 = record.spki;
    record.socket = prVar2;
    for (lVar4 = 0x5b; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    if (prVar2 != socket) {
      iVar3 = spki_table_add_entry(dst,&record);
      if (iVar3 != 0) {
        iVar3 = -1;
        goto LAB_0010c060;
      }
    }
    ptVar5 = ptVar5->next;
  } while( true );
}

Assistant:

int spki_table_copy_except_socket(struct spki_table *src, struct spki_table *dst, struct rtr_socket *socket)
{
	tommy_node *current_node;
	int ret = SPKI_SUCCESS;

	pthread_rwlock_rdlock(&src->lock);
	current_node = tommy_list_head(&src->list);
	while (current_node) {
		struct key_entry *entry;
		struct spki_record record;

		entry = (struct key_entry *)current_node->data;
		key_entry_to_spki_record(entry, &record);

		if (entry->socket != socket) {
			if (spki_table_add_entry(dst, &record) != SPKI_SUCCESS) {
				ret = SPKI_ERROR;
				break;
			}
		}
		current_node = current_node->next;
	}

	pthread_rwlock_unlock(&src->lock);

	return ret;
}